

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffc2i(char *cval,long *ival,int *status)

{
  int iVar1;
  long lVar2;
  char dtype;
  double dval;
  int lval;
  char sval [81];
  char msg [81];
  
  if (0 < *status) {
    return *status;
  }
  if (*cval == '\0') {
    *status = 0xcc;
    return 0xcc;
  }
  ffc2x(cval,&dtype,ival,&lval,sval,&dval,status);
  if (dtype == 'X') {
    iVar1 = 0x193;
LAB_0017f6cf:
    *status = iVar1;
    goto LAB_0017f6d1;
  }
  if (dtype == 'F') {
LAB_0017f685:
    iVar1 = 0x19c;
    if (9.223372036854776e+18 < ABS(dval)) goto LAB_0017f6cf;
    lVar2 = (long)dval;
LAB_0017f6bf:
    *ival = lVar2;
  }
  else {
    if (dtype == 'L') {
      lVar2 = (long)lval;
      goto LAB_0017f6bf;
    }
    if ((dtype == 'C') && (iVar1 = ffc2dd(sval,&dval,status), iVar1 < 1)) goto LAB_0017f685;
  }
  if (*status < 1) {
    return *status;
  }
LAB_0017f6d1:
  *ival = 0;
  builtin_strncpy(msg + 0x20," as an integer: ",0x11);
  builtin_strncpy(msg + 0x10,"valuating string",0x10);
  builtin_strncpy(msg,"Error in ffc2i e",0x10);
  strncat(msg,cval,0x1e);
  ffpmsg(msg);
  return *status;
}

Assistant:

int ffc2i(const char *cval,   /* I - string representation of the value */
          long *ival,         /* O - numerical value of the input string */
          int *status)        /* IO - error status */
/*
  convert formatted string to an integer value, doing implicit
  datatype conversion if necessary.
*/
{
    char dtype, sval[81], msg[81];
    int lval;
    double dval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */
        
    /* convert the keyword to its native datatype */
    ffc2x(cval, &dtype, ival, &lval, sval, &dval, status);

    if (dtype == 'X' )
    {
            *status = BAD_INTKEY;
    }
    else if (dtype == 'C')
    {
            /* try reading the string as a number */
            if (ffc2dd(sval, &dval, status) <= 0)
            {
              if (dval > (double) LONG_MAX || dval < (double) LONG_MIN)
                *status = NUM_OVERFLOW;
              else
                *ival = (long) dval;
            }
    }
    else if (dtype == 'F')
    {
            if (dval > (double) LONG_MAX || dval < (double) LONG_MIN)
                *status = NUM_OVERFLOW;
            else
                *ival = (long) dval;
    }
    else if (dtype == 'L')
    {
            *ival = (long) lval;
    }

    if (*status > 0)
    {
            *ival = 0;
            strcpy(msg,"Error in ffc2i evaluating string as an integer: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }


    return(*status);
}